

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

TheoryTerm * __thiscall Potassco::TheoryData::getTerm(TheoryData *this,Id_t id)

{
  Data *pDVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)id;
  pDVar1 = this->data_;
  uVar2 = (pDVar1->terms).top >> 3;
  if ((id < (uint)uVar2) &&
     (uVar2 = uVar3, *(long *)((long)(pDVar1->terms).mem.beg_ + uVar3 * 8) != -1)) {
    return (TheoryTerm *)(uVar3 * 8 + (long)(pDVar1->terms).mem.beg_);
  }
  fail(-2,"const TheoryTerm &Potassco::TheoryData::getTerm(Id_t) const",0x145,"hasTerm(id)",
       "Unknown term \'%u\'",uVar3,uVar2 & 0xffffffff00000000);
}

Assistant:

const TheoryTerm& TheoryData::getTerm(Id_t id) const {
	POTASSCO_REQUIRE(hasTerm(id), "Unknown term '%u'", unsigned(id));
	return terms()[id];
}